

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chartype.c
# Opt level: O0

ssize_t ct_encode_char(char *dst,size_t len,wchar_t c)

{
  int iVar1;
  size_t sVar2;
  undefined8 local_30;
  ssize_t l;
  wchar_t c_local;
  size_t len_local;
  char *dst_local;
  
  sVar2 = ct_enc_width(c);
  if (len < sVar2) {
    dst_local = (char *)0xffffffffffffffff;
  }
  else {
    iVar1 = wctomb(dst,c);
    local_30 = (char *)(long)iVar1;
    if ((long)local_30 < 0) {
      wctomb((char *)0x0,L'\0');
      local_30 = (char *)0x0;
    }
    dst_local = local_30;
  }
  return (ssize_t)dst_local;
}

Assistant:

libedit_private ssize_t
ct_encode_char(char *dst, size_t len, wchar_t c)
{
	ssize_t l = 0;
	if (len < ct_enc_width(c))
		return -1;
	l = wctomb(dst, c);

	if (l < 0) {
		wctomb(NULL, L'\0');
		l = 0;
	}
	return l;
}